

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

ImageOperandsMask __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::TranslateImageOperands
          (TGlslangToSpvTraverser *this,CoherentFlags *coherentFlags)

{
  bool bVar1;
  ImageOperandsMask a;
  uint uVar2;
  ImageOperandsMask local_24;
  ImageOperandsMask mask;
  CoherentFlags *coherentFlags_local;
  TGlslangToSpvTraverser *this_local;
  
  local_24 = ImageOperandsMaskNone;
  bVar1 = glslang::TIntermediate::usingVulkanMemoryModel(this->glslangIntermediate);
  if (bVar1) {
    if (((*(ushort *)coherentFlags >> 7 & 1) != 0) ||
       (bVar1 = spv::Builder::AccessChain::CoherentFlags::anyCoherent(coherentFlags), bVar1)) {
      a = spv::operator|(ImageOperandsMaskNone,ImageOperandsMakeTexelAvailableKHRMask);
      local_24 = spv::operator|(a,ImageOperandsMakeTexelVisibleKHRMask);
    }
    if ((*(ushort *)coherentFlags >> 6 & 1) != 0) {
      local_24 = spv::operator|(local_24,ImageOperandsNonPrivateTexelKHRMask);
    }
    if ((*(ushort *)coherentFlags >> 7 & 1) != 0) {
      local_24 = spv::operator|(local_24,ImageOperandsVolatileTexelKHRMask);
    }
    if (((*(ushort *)coherentFlags >> 8 & 1) != 0) &&
       (uVar2 = spv::Builder::getSpvVersion(&this->builder), 0x105ff < uVar2)) {
      local_24 = spv::operator|(local_24,ImageOperandsNontemporalMask);
    }
    if (local_24 != ImageOperandsMaskNone) {
      spv::Builder::addCapability(&this->builder,CapabilityVulkanMemoryModel);
    }
    this_local._4_4_ = local_24;
  }
  else {
    this_local._4_4_ = ImageOperandsMaskNone;
  }
  return this_local._4_4_;
}

Assistant:

spv::ImageOperandsMask TGlslangToSpvTraverser::TranslateImageOperands(
    const spv::Builder::AccessChain::CoherentFlags &coherentFlags)
{
    spv::ImageOperandsMask mask = spv::ImageOperandsMaskNone;

    if (!glslangIntermediate->usingVulkanMemoryModel())
        return mask;

    if (coherentFlags.volatil ||
        coherentFlags.anyCoherent()) {
        mask = mask | spv::ImageOperandsMakeTexelAvailableKHRMask |
                      spv::ImageOperandsMakeTexelVisibleKHRMask;
    }
    if (coherentFlags.nonprivate) {
        mask = mask | spv::ImageOperandsNonPrivateTexelKHRMask;
    }
    if (coherentFlags.volatil) {
        mask = mask | spv::ImageOperandsVolatileTexelKHRMask;
    }
    if (coherentFlags.nontemporal && builder.getSpvVersion() >= spv::Spv_1_6) {
        mask = mask | spv::ImageOperandsNontemporalMask;
    }
    if (mask != spv::ImageOperandsMaskNone) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    return mask;
}